

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O0

CreateResponse * __thiscall Future<CreateResponse>::get(Future<CreateResponse> *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RSI;
  CreateResponse *in_RDI;
  CreateResponse *this_00;
  undefined1 local_b0 [176];
  
  this_00 = in_RDI;
  if (((*(byte *)(in_RSI + 0xb8) & 1) == 0) &&
     (bVar1 = std::operator!=((shared_ptr<AsyncTask<CreateResponse>_> *)in_RDI,in_RDI), bVar1)) {
    peVar2 = std::
             __shared_ptr_access<AsyncTask<CreateResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AsyncTask<CreateResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1696ef);
    (**peVar2->_vptr_AsyncTask)(local_b0);
    CreateResponse::operator=(this_00,in_RDI);
    CreateResponse::~CreateResponse(this_00);
    *(undefined1 *)(in_RSI + 0xb8) = 1;
  }
  CreateResponse::CreateResponse(this_00,in_RDI);
  return this_00;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }